

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  bool local_3e;
  int local_34;
  int local_30;
  int len;
  int ch;
  int quote;
  xmlChar *ret;
  xmlChar *q;
  xmlXPathParserContextPtr ctxt_local;
  
  _ch = (xmlChar *)0x0;
  q = (xmlChar *)ctxt;
  if (*ctxt->cur == '\"') {
    len = 0x22;
  }
  else {
    if (*ctxt->cur != '\'') {
      xmlXPathErr(ctxt,3);
      return (xmlChar *)0x0;
    }
    len = 0x27;
  }
  if (*ctxt->cur != '\0') {
    ctxt->cur = ctxt->cur + 1;
  }
  ret = ctxt->cur;
  while( true ) {
    if ((uint)**(byte **)q == len) {
      _ch = xmlStrndup(ret,(int)*(undefined8 *)q - (int)ret);
      if (_ch == (xmlChar *)0x0) {
        xmlXPathPErrMemory((xmlXPathParserContextPtr)q);
      }
      if (**(char **)q != '\0') {
        *(long *)q = *(long *)q + 1;
      }
      return _ch;
    }
    local_34 = 4;
    if (**(char **)q == '\0') {
      xmlXPathErr((xmlXPathParserContextPtr)q,2);
      return (xmlChar *)0x0;
    }
    local_30 = xmlGetUTF8Char(*(uchar **)q,&local_34);
    if (local_30 < 0) break;
    if (local_30 < 0x100) {
      if (((local_30 < 9) || (local_3e = true, 10 < local_30)) && (local_3e = true, local_30 != 0xd)
         ) {
        local_3e = 0x1f < local_30;
      }
    }
    else if (((local_30 < 0x100) || (local_3e = true, 0xd7ff < local_30)) &&
            ((local_30 < 0xe000 || (local_3e = true, 0xfffd < local_30)))) {
      local_3e = 0xffff < local_30 && local_30 < 0x110000;
    }
    if (!local_3e) break;
    *(long *)q = *(long *)q + (long)local_34;
  }
  xmlXPathErr((xmlXPathParserContextPtr)q,0x15);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;
    int quote;

    if (CUR == '"') {
        quote = '"';
    } else if (CUR == '\'') {
        quote = '\'';
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }

    NEXT;
    q = CUR_PTR;
    while (CUR != quote) {
        int ch;
        int len = 4;

        if (CUR == 0)
            XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
        ch = xmlGetUTF8Char(CUR_PTR, &len);
        if ((ch < 0) || (IS_CHAR(ch) == 0))
            XP_ERRORNULL(XPATH_INVALID_CHAR_ERROR);
        CUR_PTR += len;
    }
    ret = xmlStrndup(q, CUR_PTR - q);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    NEXT;
    return(ret);
}